

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcm.c
# Opt level: O3

uchar * mcmalo0(mcmcxdef *cctx,ushort siz,mcmon *nump,mcmon clinum,int noclitrans)

{
  ushort uVar1;
  ushort uVar2;
  mcmon n;
  uint uVar3;
  mcsseg mVar4;
  uint uVar5;
  uchar *puVar6;
  ulong uVar7;
  mcmodef *pmVar8;
  undefined6 in_register_0000000a;
  uint uVar9;
  int iVar10;
  ulong uVar11;
  ushort uVar12;
  long lVar13;
  uint uVar14;
  undefined6 in_register_00000032;
  mcmon **ppmVar15;
  uint uVar16;
  mcmon n_00;
  mcmcx1def *ctx;
  mcmodef *o;
  long *plVar17;
  mcmon glb;
  mcmon newn;
  mcmon local_80;
  mcmon local_7e;
  uint local_7c;
  uint local_78;
  uint local_74;
  mcmon *local_70;
  int local_64;
  ulong local_60;
  mcmcxdef *local_58;
  mcmon *local_50;
  mcmcx1def *local_48;
  mcscxdef *local_40;
  mcmon *local_38;
  
  uVar7 = CONCAT62(in_register_0000000a,clinum) & 0xffffffff;
  uVar11 = CONCAT62(in_register_00000032,siz) & 0xffffffff;
  ctx = cctx->mcmcxgl;
  local_64 = noclitrans;
  puVar6 = mcmalo1(ctx,siz,&local_80);
  if (puVar6 == (uchar *)0x0) {
    local_70 = nump;
    mcmgarb(ctx);
    uVar14 = (uint)siz;
    puVar6 = mcmalo1(ctx,siz,&local_80);
    nump = local_70;
    if (puVar6 == (uchar *)0x0) {
      if ((short)uVar11 == 0) {
LAB_002147f6:
        nump = local_70;
        puVar6 = mcmalo1(ctx,siz,&local_80);
        if (puVar6 == (uchar *)0x0) {
          errsigf(ctx->mcmcxerr,"TADS",0xb);
        }
      }
      else {
        local_50 = &ctx->mcmcxlru;
        local_40 = &ctx->mcmcxswc;
        local_38 = &ctx->mcmcxfre;
        uVar9 = 1;
        uVar12 = 0;
        local_78 = (uint)CONCAT62(in_register_00000032,siz);
        local_7c = (uint)siz;
        local_60 = uVar7;
        local_58 = cctx;
        local_48 = ctx;
        do {
          do {
            n_00 = *local_50;
            uVar3 = uVar9;
            if (n_00 != 0xffff) {
              do {
                local_74 = uVar3;
                pmVar8 = ctx->mcmcxtab[n_00 >> 8];
                uVar7 = (ulong)((n_00 & 0xff) << 5);
                uVar1 = *(ushort *)((long)&pmVar8->mcmonxt + uVar7);
                if (((*(byte *)((long)&pmVar8->mcmoflg + uVar7) & 100) == 0) &&
                   ((plVar17 = (long *)((long)&pmVar8->mcmoptr + uVar7), uVar9 == 2 ||
                    ((ushort)uVar11 <= *(ushort *)(plVar17 + 3))))) {
                  pmVar8 = mcmoal(ctx,&local_7e);
                  n = local_7e;
                  ctx = local_48;
                  if (local_7e != 0xffff) {
                    uVar2 = *(ushort *)((long)plVar17 + 0x14);
                    if ((uVar2 & 3) != 0) {
                      mVar4 = 0xffff;
                      if ((uVar2 & 2) == 0) {
                        mVar4 = *(mcsseg *)(plVar17 + 1);
                      }
                      mVar4 = mcsout(local_40,(uint)n_00,(uchar *)*plVar17,*(ushort *)(plVar17 + 3),
                                     mVar4,uVar2 & 1);
                      *(mcsseg *)(plVar17 + 1) = mVar4;
                    }
                    ctx = local_48;
                    pmVar8->mcmoptr = (uchar *)*plVar17;
                    pmVar8->mcmosiz = *(ushort *)(plVar17 + 3);
                    pmVar8->mcmoflg = 0x80;
                    *(mcmon *)(*plVar17 + -8) = n;
                    mcmlnkhd(local_48,local_38,n);
                    *(byte *)((long)plVar17 + 0x14) = *(byte *)((long)plVar17 + 0x14) & 0xf7;
                    mcmunl(ctx,n_00,local_50);
                    uVar12 = uVar12 + (short)plVar17[3];
                  }
                  uVar11 = (ulong)local_78;
                  uVar9 = local_74;
                  uVar14 = local_7c;
                }
              } while ((uVar1 != 0xffff) &&
                      (n_00 = uVar1, uVar3 = local_74, uVar12 < (ushort)uVar11));
            }
            cctx = local_58;
            uVar7 = local_60;
            nump = local_70;
            siz = (ushort)uVar14;
          } while ((uVar9 < 2) && (uVar9 = uVar9 + 1, uVar12 < (ushort)uVar11));
          if (uVar12 == 0) goto LAB_002147f6;
          puVar6 = mcmalo1(ctx,siz,&local_80);
          if (puVar6 != (uchar *)0x0) break;
          mcmgarb(ctx);
          puVar6 = mcmalo1(ctx,siz,&local_80);
          uVar12 = 0;
          uVar9 = 1;
          uVar7 = local_60;
          cctx = local_58;
          nump = local_70;
        } while (puVar6 == (uchar *)0x0);
      }
    }
  }
  if (local_64 == 0) {
    if ((short)uVar7 == -1) {
      if (cctx->mcmcxmsz == 0) {
LAB_002148fb:
        errsigf(ctx->mcmcxerr,"TADS",10);
      }
      ppmVar15 = cctx->mcmcxmtb;
      iVar10 = 0;
      uVar5 = 0xffffffff;
      uVar16 = 0;
      do {
        if (*ppmVar15 == (mcmon *)0x0) {
          if (uVar5 == 0xffffffff) {
            uVar5 = uVar16;
          }
        }
        else {
          lVar13 = 0;
          do {
            if ((*ppmVar15)[lVar13] == 0xffff) {
              uVar7 = (ulong)(uint)((int)lVar13 - iVar10);
              goto LAB_002148a1;
            }
            lVar13 = lVar13 + 1;
          } while (((uint)lVar13 & 0xffff) != 0x100);
        }
        uVar16 = uVar16 + 1;
        ppmVar15 = ppmVar15 + 1;
        iVar10 = iVar10 + -0x100;
      } while (uVar16 != cctx->mcmcxmsz);
      if (uVar5 == 0xffffffff) goto LAB_002148fb;
      uVar7 = (ulong)(uVar5 << 8);
    }
LAB_002148a1:
    mcmcliexp(cctx,(mcmon)uVar7);
    if (cctx->mcmcxmtb[(uVar7 & 0xffff) >> 8][uVar7 & 0xff] != 0xffff) {
      errsigf(ctx->mcmcxerr,"TADS",9);
    }
    cctx->mcmcxmtb[(uVar7 & 0xffff) >> 8][uVar7 & 0xff] = local_80;
    local_80 = (mcmon)uVar7;
    if (nump == (mcmon *)0x0) {
      return puVar6;
    }
  }
  *nump = local_80;
  return puVar6;
}

Assistant:

uchar *mcmalo0(mcmcxdef *cctx, ushort siz, mcmon *nump,
               mcmon clinum, int noclitrans)
{
    uchar     *ret;
    mcmcx1def *ctx = cctx->mcmcxgl;                       /* global context */
    mcmon      glb;                       /* global object number allocated */
    
    MCMCLICTX(cctx);
    MCMGLBCTX(ctx);
    
    /* try once */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;

    /* collect some garbage */
    mcmgarb(ctx);
    
    /* try swapping until we get the memory or have nothing left to swap */
    for ( ;; )
    {
        /* try again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* nothing left to swap? */
        if (!mcmswap(ctx, siz))
            break;

        /* try yet again */
        if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
            goto done;

        /* collect garbage once again */        
        mcmgarb(ctx);
    }
    
    /* try again */
    if ((ret = mcmalo1(ctx, siz, &glb)) != 0)
        goto done;
    
    /* we have no other way of getting more memory, so signal an error */
    errsig(ctx->mcmcxerr, ERR_NOMEM1);
    NOTREACHEDV(uchar *);
    
done:
    if (noclitrans)
    {
        *nump = glb;
        return(ret);
    }
    
    /* we have an object - generate client number */
    if (clinum == MCMONINV)
    {
        /* find a free number */
        mcmon **p;
        uint    i;
        mcmon   j;
        mcmon  *q;
        int     found = FALSE;
        int     unused = -1;
        
        for (i = 0, p = cctx->mcmcxmtb ; i < cctx->mcmcxmsz ; ++i, ++p)
        {
            if (*p)
            {
                for (j = 0, q = *p ; j < 256 ; ++j, ++q)
                {
                    if (*q == MCMONINV)
                    {
                        found = TRUE;
                        break;
                    }
                }
            }
            else if (unused == -1)
                unused = i;            /* note an unused page mapping table */

            if (found) break;
        }
        
        if (found)
            clinum = (i << 8) + j;
        else if (unused != -1)
            clinum = (unused << 8);
        else
            errsig(ctx->mcmcxerr, ERR_CLIFULL);
    }

    /* expand client mapping table if necessary */
    mcmcliexp(cctx, clinum);

    /* make sure the entry isn't already in use */
    if (mcmc2g(cctx, clinum) != MCMONINV)
        errsig(ctx->mcmcxerr, ERR_CLIUSE);

    cctx->mcmcxmtb[clinum >> 8][clinum & 255] = glb;
    if (nump) *nump = clinum;
    return(ret);
}